

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

bool __thiscall roaring::Roaring64Map::contains(Roaring64Map *this,uint64_t x)

{
  bool bVar1;
  const_iterator cVar2;
  key_type local_14;
  
  cVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
          ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
                  *)this,&local_14);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->roarings)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    bVar1 = Roaring::contains((Roaring *)&cVar2._M_node[1]._M_parent,(uint32_t)x);
  }
  return bVar1;
}

Assistant:

bool contains(uint64_t x) const {
        auto iter = roarings.find(highBytes(x));
        if (iter == roarings.end()) {
            return false;
        }
        return iter->second.contains(lowBytes(x));
    }